

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  uint uVar2;
  ulong uVar3;
  BPMNode *pBVar4;
  BPMNode *pBVar5;
  ulong uVar6;
  undefined4 uVar7;
  BPMNode *leaves;
  ulong uVar8;
  ulong uVar9;
  BPMNode *pBVar10;
  BPMNode **ppBVar11;
  BPMNode **ppBVar12;
  uint uVar13;
  ulong uVar14;
  BPMNode *pBVar15;
  BPMNode *pBVar16;
  ulong uVar17;
  ulong uVar18;
  ulong numpresent;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  BPMLists lists;
  BPMLists local_78;
  size_t local_40;
  ulong local_38;
  
  uVar13 = 0x50;
  if (numcodes - 1 < (ulong)(uint)(1 << (maxbitlen & 0x1f))) {
    leaves = (BPMNode *)malloc(numcodes * 0x18);
    if (leaves == (BPMNode *)0x0) {
      uVar13 = 0x53;
    }
    else {
      uVar8 = 0;
      uVar9 = 0;
      do {
        numpresent = uVar9;
        if (frequencies[uVar8] != 0) {
          numpresent = uVar9 + 1;
          leaves[uVar9].weight = frequencies[uVar8];
          leaves[uVar9].index = (uint)uVar8;
        }
        uVar8 = uVar8 + 1;
        uVar9 = numpresent;
      } while ((uVar8 & 0xffffffff) != numcodes);
      uVar9 = 0;
      do {
        lengths[uVar9] = 0;
        uVar9 = uVar9 + 1;
      } while ((uVar9 & 0xffffffff) != numcodes);
      if (numpresent == 1) {
        uVar2 = leaves->index;
        lengths[uVar2] = 1;
        uVar13 = 0;
        lengths[(ulong)uVar2 == 0] = 1;
      }
      else if (numpresent == 0) {
        uVar13 = 0;
        lengths[0] = 1;
        lengths[1] = 1;
      }
      else {
        local_40 = numpresent * 0x18;
        pBVar10 = (BPMNode *)malloc(local_40);
        uVar9 = 1;
        uVar8 = 0;
        do {
          local_38 = uVar8;
          uVar3 = uVar9 * 2;
          pBVar16 = pBVar10;
          pBVar15 = leaves;
          if ((local_38 & 1) == 0) {
            pBVar16 = leaves;
            pBVar15 = pBVar10;
          }
          uVar8 = 0;
          do {
            uVar17 = uVar8 + uVar3;
            uVar14 = uVar8 + uVar9;
            if (numpresent <= uVar8 + uVar9) {
              uVar14 = numpresent;
            }
            uVar19 = uVar14;
            pBVar5 = pBVar15;
            uVar6 = uVar8;
            uVar21 = numpresent;
            if (uVar17 < numpresent) {
              uVar21 = uVar17;
            }
            for (; uVar8 < uVar21; uVar8 = uVar8 + 1) {
              if ((uVar6 < uVar14) &&
                 ((uVar21 <= uVar19 || (pBVar16[uVar6].weight <= pBVar16[uVar19].weight)))) {
                uVar20 = uVar6 + 1;
                uVar18 = uVar6;
              }
              else {
                uVar18 = uVar19;
                uVar19 = uVar19 + 1;
                uVar20 = uVar6;
              }
              uVar7 = *(undefined4 *)&pBVar16[uVar18].field_0x14;
              pBVar5->in_use = pBVar16[uVar18].in_use;
              *(undefined4 *)&pBVar5->field_0x14 = uVar7;
              pBVar1 = pBVar16 + uVar18;
              uVar13 = pBVar1->index;
              pBVar4 = pBVar1->tail;
              pBVar5->weight = pBVar1->weight;
              pBVar5->index = uVar13;
              pBVar5->tail = pBVar4;
              pBVar5 = pBVar5 + 1;
              uVar6 = uVar20;
            }
            pBVar15 = pBVar15 + uVar9 * 2;
            uVar8 = uVar17;
          } while (uVar17 < numpresent);
          uVar9 = uVar3;
          uVar8 = local_38 + 1;
        } while (uVar3 < numpresent);
        if ((local_38 & 1) == 0) {
          memcpy(leaves,pBVar10,local_40);
        }
        free(pBVar10);
        local_78.memsize = (maxbitlen + 1) * maxbitlen * 2;
        uVar9 = (ulong)local_78.memsize;
        local_78.nextfree = 0;
        local_78.numfree = local_78.memsize;
        local_78.listsize = maxbitlen;
        pBVar10 = (BPMNode *)malloc(uVar9 * 0x18);
        local_78.memory = pBVar10;
        ppBVar11 = (BPMNode **)malloc(uVar9 * 8);
        local_78.freelist = ppBVar11;
        ppBVar12 = (BPMNode **)malloc((ulong)maxbitlen << 3);
        local_78.chains0 = ppBVar12;
        local_78.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
        uVar13 = 0x53;
        if (((ppBVar12 != (BPMNode **)0x0 && ppBVar11 != (BPMNode **)0x0) &&
            pBVar10 != (BPMNode *)0x0) && local_78.chains1 != (BPMNode **)0x0) {
          if (uVar9 != 0) {
            auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar23 = vpbroadcastq_avx512f(ZEXT816(0x18));
            auVar24 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar25 = vpbroadcastq_avx512f();
            uVar8 = 0;
            auVar26 = vpbroadcastq_avx512f();
            do {
              auVar27 = vpmullq_avx512dq(auVar22,auVar23);
              vpcmpuq_avx512f(auVar22,auVar26,2);
              auVar22 = vpaddq_avx512f(auVar22,auVar24);
              auVar27 = vpaddq_avx512f(auVar25,auVar27);
              auVar27 = vmovdqu64_avx512f(auVar27);
              *(undefined1 (*) [64])(ppBVar11 + uVar8) = auVar27;
              uVar8 = uVar8 + 8;
            } while ((uVar9 + 7 & 0xfffffffffffffff8) != uVar8);
          }
          bpmnode_create(&local_78,leaves->weight,1,(BPMNode *)0x0);
          bpmnode_create(&local_78,leaves[1].weight,2,(BPMNode *)0x0);
          if ((ulong)local_78.listsize != 0) {
            uVar9 = 0;
            do {
              local_78.chains0[uVar9] = local_78.memory;
              local_78.chains1[uVar9] = local_78.memory + 1;
              uVar9 = uVar9 + 1;
            } while (local_78.listsize != uVar9);
          }
          uVar9 = numpresent * 2 - 2;
          if (uVar9 != 2) {
            uVar8 = 2;
            do {
              boundaryPM(&local_78,leaves,numpresent,maxbitlen - 1,(int)uVar8);
              uVar8 = (ulong)((int)uVar8 + 1);
            } while (uVar9 != uVar8);
          }
          for (pBVar10 = local_78.chains1[maxbitlen - 1]; uVar13 = 0, pBVar10 != (BPMNode *)0x0;
              pBVar10 = pBVar10->tail) {
            if (pBVar10->index != 0) {
              uVar9 = 0;
              do {
                uVar13 = (int)uVar9 + 1;
                lengths[leaves[uVar9].index] = lengths[leaves[uVar9].index] + 1;
                uVar9 = (ulong)uVar13;
              } while (uVar13 != pBVar10->index);
            }
          }
        }
        ppBVar11 = local_78.chains1;
        free(local_78.memory);
        free(local_78.freelist);
        free(local_78.chains0);
        free(ppBVar11);
      }
      free(leaves);
    }
  }
  return uVar13;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i)
  {
    if(frequencies[i] > 0)
    {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0)
  {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if(numpresent == 1)
  {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else
  {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error)
    {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i)
      {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail)
      {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}